

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stringutil.cpp
# Opt level: O2

size_t first_word_end(string *str,size_t start)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  string chars;
  allocator local_39;
  string local_38 [32];
  
  std::__cxx11::string::string(local_38,"\t\n\v\f\r ",&local_39);
  std::__cxx11::string::find_first_not_of((string *)str,(ulong)local_38);
  uVar2 = std::__cxx11::string::find_first_of((string *)str,(ulong)local_38);
  uVar1 = str->_M_string_length;
  uVar3 = uVar1;
  if (uVar2 < uVar1) {
    uVar3 = uVar2;
  }
  if (uVar2 == 0xffffffffffffffff) {
    uVar3 = uVar1;
  }
  std::__cxx11::string::~string(local_38);
  return uVar3;
}

Assistant:

size_t first_word_end(std::string& str, size_t start) {
  const std::string chars = "\t\n\v\f\r ";
  size_t next_word_start = str.find_first_not_of(chars, start);
  size_t next_word_end = str.find_first_of(chars, next_word_start);
  if (next_word_end == std::string::npos || next_word_end > str.size())
    return str.size();
  return next_word_end;
}